

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void auto_commit_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  fdb_kvs_handle **ppfVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  fdb_config *pfVar10;
  long lVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle;
  uint uVar14;
  size_t *unaff_RBP;
  fdb_doc *__s;
  char *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  char *unaff_R14;
  ulong uVar15;
  fdb_doc **doc_00;
  fdb_kvs_handle *unaff_R15;
  char *pcVar16;
  fdb_kvs_handle **ppfVar17;
  char *handle;
  bool bVar18;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t valuelen;
  void *value_out;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1bae0;
  fdb_file_handle *pfStack_1bad8;
  void *pvStack_1bad0;
  size_t asStack_1bac8 [3];
  undefined4 uStack_1bab0;
  undefined4 uStack_1baac;
  undefined4 uStack_1baa8;
  undefined4 uStack_1baa4;
  undefined4 uStack_1baa0;
  fdb_kvs_config fStack_1ba98;
  timeval tStack_1ba80;
  fdb_config fStack_1ba70;
  char acStack_1b978 [256];
  char acStack_1b878 [256];
  char acStack_1b778 [264];
  fdb_config *pfStack_1b670;
  fdb_kvs_handle **ppfStack_1b668;
  fdb_kvs_handle *pfStack_1b660;
  fdb_kvs_handle **ppfStack_1b658;
  fdb_kvs_handle *pfStack_1b650;
  code *pcStack_1b648;
  fdb_kvs_handle *pfStack_1b630;
  fdb_file_handle *pfStack_1b628;
  fdb_kvs_handle *pfStack_1b620;
  fdb_kvs_handle *pfStack_1b618;
  fdb_kvs_config fStack_1b610;
  timeval tStack_1b5f8;
  fdb_config fStack_1b5e8;
  fdb_kvs_handle *apfStack_1b4f0 [32];
  fdb_config fStack_1b3f0;
  fdb_kvs_handle **ppfStack_1b2e8;
  fdb_kvs_handle **ppfStack_1b2e0;
  fdb_kvs_handle **ppfStack_1b2d8;
  fdb_kvs_handle *pfStack_1b2d0;
  fdb_kvs_handle *pfStack_1b2c0;
  fdb_kvs_handle *pfStack_1b2b8;
  fdb_kvs_handle **ppfStack_1b2b0;
  fdb_kvs_handle *pfStack_1b2a8;
  fdb_kvs_config fStack_1b2a0;
  undefined1 auStack_1b288 [128];
  fdb_kvs_handle *apfStack_1b208 [33];
  fdb_config fStack_1b100;
  fdb_kvs_handle *apfStack_1b008 [32];
  fdb_kvs_handle *apfStack_1af08 [32];
  fdb_kvs_handle fStack_1ae08;
  undefined8 auStack_1aa08 [896];
  fdb_kvs_handle *apfStack_18e08 [1025];
  fdb_doc **ppfStack_16e00;
  char *pcStack_16df8;
  long lStack_16df0;
  fdb_doc *pfStack_16de8;
  fdb_doc **ppfStack_16de0;
  fdb_doc *pfStack_16dd8;
  fdb_doc *pfStack_16dc0;
  fdb_file_handle *pfStack_16db8;
  long lStack_16db0;
  fdb_kvs_handle *pfStack_16da8;
  long lStack_16da0;
  long lStack_16d98;
  fdb_doc **ppfStack_16d90;
  long lStack_16d88;
  fdb_doc **ppfStack_16d80;
  size_t sStack_16d78;
  timeval tStack_16d70;
  fdb_kvs_config fStack_16d60;
  fdb_file_info fStack_16d48;
  fdb_doc afStack_16d00 [3];
  char acStack_16c00 [264];
  fdb_config fStack_16af8;
  char acStack_16a00 [256];
  fdb_doc *apfStack_16900 [2999];
  size_t sStack_10b48;
  size_t asStack_10b40 [1023];
  undefined1 auStack_eb41 [57225];
  fdb_doc **ppfStack_bb8;
  fdb_config *pfStack_bb0;
  fdb_file_handle **ppfStack_ba8;
  ulong uStack_ba0;
  fdb_kvs_handle **ppfStack_b98;
  fdb_kvs_handle **ppfStack_b90;
  fdb_doc *pfStack_b78;
  fdb_kvs_handle *pfStack_b70;
  undefined1 auStack_b68 [24];
  fdb_file_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b48;
  fdb_kvs_config fStack_b40;
  fdb_doc *apfStack_b28 [31];
  timeval tStack_a30;
  fdb_config fStack_a20;
  char acStack_928 [256];
  fdb_file_handle *apfStack_828 [32];
  char acStack_728 [264];
  fdb_kvs_handle **ppfStack_620;
  char *pcStack_618;
  char *pcStack_610;
  ulong uStack_608;
  undefined8 uStack_600;
  code *pcStack_5f8;
  fdb_file_handle *pfStack_5f0;
  fdb_kvs_handle *pfStack_5e8;
  char acStack_5e0 [32];
  fdb_kvs_config fStack_5c0;
  timeval tStack_5a8;
  fdb_file_info afStack_598 [3];
  fdb_config fStack_4a0;
  fdb_config *pfStack_3a8;
  char *pcStack_3a0;
  fdb_kvs_handle *pfStack_398;
  char *pcStack_390;
  fdb_kvs_handle *pfStack_388;
  code *pcStack_380;
  fdb_kvs_handle *local_370;
  fdb_file_handle *local_368;
  size_t local_360;
  fdb_kvs_handle *local_358;
  fdb_kvs_config local_350;
  timeval local_338;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_380 = (code *)0x117e6a;
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  pcStack_380 = (code *)0x117e6f;
  memleak_start();
  pcStack_380 = (code *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar10 = &local_128;
  pcStack_380 = (code *)0x117e8b;
  fdb_get_default_config();
  pcStack_380 = (code *)0x117e95;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x1000;
  local_128.flags = 1;
  local_128.durability_opt = '\x02';
  local_128.auto_commit = true;
  pcStack_380 = (code *)0x117ec8;
  fVar3 = fdb_open(&local_368,"dummy1",pfVar10);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011817d;
  pcStack_380 = (code *)0x117ee4;
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  pcVar16 = (char *)unaff_R15;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
  pcVar16 = "body%d";
  unaff_RBP = (size_t *)0x0;
  do {
    pcStack_380 = (code *)0x117f15;
    sprintf(local_228,"key%d",unaff_RBP);
    pcStack_380 = (code *)0x117f24;
    sprintf(local_328,"body%d",unaff_RBP);
    unaff_R13 = local_370;
    pcStack_380 = (code *)0x117f31;
    sVar5 = strlen(local_228);
    pfVar10 = (fdb_config *)(sVar5 + 1);
    pcStack_380 = (code *)0x117f3d;
    sVar5 = strlen(local_328);
    pcStack_380 = (code *)0x117f52;
    fVar3 = fdb_set_kv(unaff_R13,local_228,(size_t)pfVar10,local_328,sVar5 + 1);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_380 = (code *)0x118159;
      auto_commit_test();
      goto LAB_00118159;
    }
    uVar14 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t *)(ulong)uVar14;
  } while (uVar14 != 5000);
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  unaff_R13 = (fdb_kvs_handle *)&local_358;
  unaff_RBP = &local_360;
  pfVar10 = (fdb_config *)0x0;
  do {
    pcStack_380 = (code *)0x117f90;
    sprintf(unaff_R14,"key%d",pfVar10);
    pcStack_380 = (code *)0x117fa3;
    sprintf(unaff_R12,"body%d",pfVar10);
    pfVar9 = local_370;
    pcStack_380 = (code *)0x117fb0;
    sVar5 = strlen(unaff_R14);
    pcStack_380 = (code *)0x117fc5;
    fVar3 = fdb_get_kv(pfVar9,unaff_R14,sVar5 + 1,(void **)unaff_R13,unaff_RBP);
    pcVar16 = (char *)local_358;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
    pcStack_380 = (code *)0x117fe2;
    iVar4 = bcmp(local_358,unaff_R12,local_360);
    if (iVar4 != 0) goto LAB_00118159;
    pcStack_380 = (code *)0x117ff2;
    fdb_free_block(pcVar16);
    uVar14 = (int)pfVar10 + 1;
    pfVar10 = (fdb_config *)(ulong)uVar14;
  } while (uVar14 != 5000);
  pcStack_380 = (code *)0x118006;
  fVar3 = fdb_kvs_close(local_370);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
  pcStack_380 = (code *)0x118018;
  fVar3 = fdb_close(local_368);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
  pcStack_380 = (code *)0x118039;
  fVar3 = fdb_open(&local_368,"dummy1",&local_128);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
  pcStack_380 = (code *)0x118055;
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  unaff_R13 = (fdb_kvs_handle *)&local_358;
  unaff_RBP = &local_360;
  pfVar10 = (fdb_config *)0x0;
  do {
    pcStack_380 = (code *)0x118089;
    sprintf(unaff_R14,"key%d",pfVar10);
    pcStack_380 = (code *)0x11809c;
    sprintf(unaff_R12,"body%d",pfVar10);
    unaff_R15 = local_370;
    pcStack_380 = (code *)0x1180a9;
    sVar5 = strlen(unaff_R14);
    pcStack_380 = (code *)0x1180be;
    fVar3 = fdb_get_kv(unaff_R15,unaff_R14,sVar5 + 1,(void **)unaff_R13,unaff_RBP);
    pcVar16 = (char *)local_358;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
    pcStack_380 = (code *)0x1180db;
    iVar4 = bcmp(local_358,unaff_R12,local_360);
    if (iVar4 != 0) goto LAB_0011816b;
    pcStack_380 = (code *)0x1180eb;
    fdb_free_block(pcVar16);
    uVar14 = (int)pfVar10 + 1;
    pfVar10 = (fdb_config *)(ulong)uVar14;
  } while (uVar14 != 5000);
  pcStack_380 = (code *)0x1180ff;
  fVar3 = fdb_close(local_368);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_380 = (code *)0x11810c;
    fdb_shutdown();
    pcStack_380 = (code *)0x118111;
    memleak_end();
    pcVar16 = "%s PASSED\n";
    if (auto_commit_test()::__test_pass != '\0') {
      pcVar16 = "%s FAILED\n";
    }
    pcStack_380 = (code *)0x118142;
    fprintf(_stderr,pcVar16,"auto commit test");
    return;
  }
  goto LAB_0011819b;
LAB_0011943e:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_00118159:
  pcStack_380 = (code *)0x118166;
  auto_commit_test();
  pfVar9 = (fdb_kvs_handle *)pcVar16;
LAB_00118166:
  pcVar16 = (char *)pfVar9;
  pcStack_380 = (code *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pcStack_380 = (code *)0x118178;
  auto_commit_test();
  unaff_R15 = (fdb_kvs_handle *)pcVar16;
LAB_00118178:
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  pcStack_380 = (code *)0x11817d;
  auto_commit_test();
LAB_0011817d:
  pcStack_380 = (code *)0x118182;
  auto_commit_test();
  pcVar16 = (char *)unaff_R15;
LAB_00118182:
  pcStack_380 = (code *)0x118187;
  auto_commit_test();
LAB_00118187:
  pcStack_380 = (code *)0x11818c;
  auto_commit_test();
LAB_0011818c:
  pcStack_380 = (code *)0x118191;
  auto_commit_test();
LAB_00118191:
  pcStack_380 = (code *)0x118196;
  auto_commit_test();
LAB_00118196:
  pcStack_380 = (code *)0x11819b;
  auto_commit_test();
LAB_0011819b:
  pcStack_380 = auto_commit_space_used_test;
  auto_commit_test();
  pcStack_5f8 = (code *)0x1181bd;
  pfStack_3a8 = pfVar10;
  pcStack_3a0 = unaff_R12;
  pfStack_398 = unaff_R13;
  pcStack_390 = unaff_R14;
  pfStack_388 = (fdb_kvs_handle *)pcVar16;
  pcStack_380 = (code *)unaff_RBP;
  gettimeofday(&tStack_5a8,(__timezone_ptr_t)0x0);
  pcStack_5f8 = (code *)0x1181c2;
  memleak_start();
  pcStack_5f8 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_5f8 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_4a0.buffercache_size = 0;
  fStack_4a0.auto_commit = true;
  pcStack_5f8 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_5f8 = (code *)0x118207;
  memcpy(&fStack_4a0,afStack_598,0xf8);
  pcStack_5f8 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar15 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_5e0 + 8,"est1",5);
    builtin_strncpy(acStack_5e0,"./func_t",8);
    pcStack_5f8 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_5f0,acStack_5e0,&fStack_4a0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_5f8 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_5f0,&pfStack_5e8,"justonekv",&fStack_5c0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_5f8 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_5f8 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_5f0,afStack_598);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_598[0].file_size != fStack_4a0.blocksize * 7) {
      pcStack_5f8 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_5f8 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_5f0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar14 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_5f8 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_5f8 = (code *)0x1182e9;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_5f8 = (code *)0x11831a;
      fprintf(_stderr,pcVar16,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_5f8 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_5f8 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_5f8 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_600 = 0x745f636e75662f2e;
  pcStack_610 = "justonekv";
  ppfStack_b90 = (fdb_kvs_handle **)0x118363;
  ppfStack_620 = &pfStack_5e8;
  pcStack_618 = acStack_5e0;
  uStack_608 = uVar15;
  pcStack_5f8 = (code *)&pfStack_5f0;
  gettimeofday(&tStack_a30,(__timezone_ptr_t)0x0);
  ppfStack_b90 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_b78 = (fdb_doc *)0x0;
  ppfStack_b90 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_b90 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_b90 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_a20.buffercache_size = 0;
  fStack_a20.flags = 1;
  fStack_a20.purging_interval = 0;
  fStack_a20.compaction_threshold = '\0';
  ppfStack_b90 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  ppfVar12 = apfStack_b28;
  uVar15 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_928,"key%d",uVar15 & 0xffffffff);
    ppfStack_b90 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_728,"meta%d",uVar15 & 0xffffffff);
    ptr_fhandle = apfStack_828;
    ppfStack_b90 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar15 & 0xffffffff);
    ppfStack_b90 = (fdb_kvs_handle **)0x118462;
    ppfVar6 = (fdb_kvs_handle **)strlen(acStack_928);
    ppfStack_b90 = (fdb_kvs_handle **)0x11846d;
    sVar5 = strlen(acStack_728);
    ppfStack_b90 = (fdb_kvs_handle **)0x118478;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_b90 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar12,acStack_928,(size_t)ppfVar6,acStack_728,sVar5,ptr_fhandle,sVar7);
    uVar15 = uVar15 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar15 != 0x1e);
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_b70,apfStack_b28[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  ppfStack_b90 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar10 = &fStack_a20;
  ppfStack_b90 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",pfVar10);
  ppfStack_b90 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",pfVar10);
  ppfStack_b90 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  uVar15 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar15]->key,apfStack_b28[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if (uVar15 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_b90 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  ppfStack_b90 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_b70,apfStack_b28[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar10 = &fStack_a20;
  ppfStack_b90 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",pfVar10);
  ppfStack_b90 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",pfVar10);
  ppfStack_b90 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  uVar15 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar15]->key,apfStack_b28[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if ((uVar15 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_b90 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_b90 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_b70,apfStack_b28[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar11 + 6]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_b50,"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_b50,&pfStack_b48,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_b50,'\x02');
  lVar11 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_b48,apfStack_b28[lVar11 + 8]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_b50,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_b50);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  uVar15 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar15]->key,apfStack_b28[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if ((int)uVar15 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_b90 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfVar10 = (fdb_config *)auStack_b68;
  ppfStack_b90 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar10,"dummy1",&fStack_a20);
  ptr_fhandle = &pfStack_b50;
  ppfStack_b90 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_a20);
  ppfVar17 = (fdb_kvs_handle **)(auStack_b68 + 8);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._0_8_,ppfVar17,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_b50,&pfStack_b48,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  ppfVar6 = &pfStack_b70;
  ppfStack_b90 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_b70,apfStack_b28[10]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_b70,apfStack_b28[0xb]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0xc]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0xd]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_b50,'\x02');
  ppfStack_b90 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_b48,apfStack_b28[0xe]);
  ppfStack_b90 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_b48,apfStack_b28[0xf]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_b70,apfStack_b28[0x10]);
  ppfStack_b90 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_b50,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_b70,apfStack_b28[0x11]);
  uVar15 = 0;
  ppfStack_b90 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\0');
  ppfStack_b90 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_b50);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,ppfVar6,&fStack_b40);
  while( true ) {
    ppfStack_b90 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar15 + 10]->key,apfStack_b28[uVar15 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_b90 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
    if (uVar15 == 8) {
      ppfStack_b90 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_b68,"dummy1",&fStack_a20);
      ppfStack_b90 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),
                 &fStack_b40);
      ppfStack_b90 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
      ppfStack_b90 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0x14]);
      ppfStack_b90 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_b68._16_8_,"dummy2");
      ppfStack_b90 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
      ppfStack_b90 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_b68._16_8_);
      ppfStack_b90 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_b68._0_8_);
      lVar11 = 0;
      do {
        ppfStack_b90 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_b28[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1e);
      ppfStack_b90 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_b90 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      ppfStack_b90 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar16,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_b90 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_b90 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_b90 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_b90 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_b90 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_16dd8 = (fdb_doc *)0x118b77;
  ppfStack_bb8 = &pfStack_b78;
  pfStack_bb0 = pfVar10;
  ppfStack_ba8 = ptr_fhandle;
  uStack_ba0 = uVar15;
  ppfStack_b98 = ppfVar17;
  ppfStack_b90 = ppfVar6;
  gettimeofday(&tStack_16d70,(__timezone_ptr_t)0x0);
  pfStack_16dd8 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_16dc0 = (fdb_doc *)0x0;
  pfStack_16dd8 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_16dd8 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_16dd8 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_16af8.flags = 1;
  fStack_16af8.purging_interval = 0;
  fStack_16af8.compaction_threshold = '\0';
  fStack_16af8.durability_opt = '\x02';
  pfStack_16dd8 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_16db8,"dummy1",&fStack_16af8);
  pfStack_16dd8 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_16db8,&pfStack_16da8,&fStack_16d60);
  ppfVar12 = apfStack_16900;
  __s = afStack_16d00;
  pfVar13 = (fdb_doc *)0x0;
  lVar11 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar11 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar11 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_16dd8 = (fdb_doc *)0x118c39;
    lStack_16da0 = lVar11;
    memset(asStack_10b40,0x5f,sVar5);
    *(undefined1 *)((long)asStack_10b40 + sVar5) = 0;
    lVar11 = 0;
    doc_00 = ppfVar12;
    lStack_16d98 = (long)pfVar13;
    ppfStack_16d90 = ppfVar12;
    sStack_16d78 = sVar5;
    do {
      pfStack_16dd8 = (fdb_doc *)0x118c6f;
      lStack_16d88 = lVar11;
      sprintf((char *)__s,"%08d");
      asStack_10b40[0] = afStack_16d00[0].keylen;
      uVar15 = 0;
      lStack_16db0 = (long)pfVar13;
      ppfStack_16d80 = doc_00;
      do {
        pfStack_16dd8 = (fdb_doc *)0x118cab;
        sprintf((char *)__s,"%08d",uVar15 & 0xffffffff);
        *(size_t *)((long)apfStack_16900 + sStack_16d78 + 0x5db8) = afStack_16d00[0].keylen;
        uVar14 = (int)lStack_16db0 + (int)uVar15;
        pfStack_16dd8 = (fdb_doc *)0x118ce4;
        sprintf(acStack_16a00,"meta%d",(ulong)uVar14);
        pfStack_16dd8 = (fdb_doc *)0x118cf7;
        sprintf(acStack_16c00,"body%d",(ulong)uVar14);
        pfStack_16dd8 = (fdb_doc *)0x118d04;
        sVar5 = strlen((char *)asStack_10b40);
        pfStack_16dd8 = (fdb_doc *)0x118d10;
        sVar7 = strlen(acStack_16a00);
        pfStack_16dd8 = (fdb_doc *)0x118d24;
        sVar8 = strlen(acStack_16c00);
        lVar1 = lStack_16db0;
        pcVar16 = acStack_16c00;
        pfStack_16dd8 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_10b40,sVar5 + 1,acStack_16a00,sVar7 + 1,pcVar16,sVar8 + 1);
        uVar15 = uVar15 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar15 != 10);
      lVar11 = lStack_16d88 + 1;
      doc_00 = ppfStack_16d80 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar11 != 100);
    lVar11 = lStack_16da0 + 1;
    ppfVar12 = ppfStack_16d90 + 1000;
    pfVar13 = (fdb_doc *)(lStack_16d98 + 1000);
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pfStack_16dd8 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_16da8,apfStack_16900[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3000);
  pfStack_16dd8 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_16db8,'\x01');
  pfStack_16dd8 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_16db8,&fStack_16d48);
  if (fStack_16d48.doc_count != 3000) {
    pfStack_16dd8 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar11 = 0;
  while( true ) {
    pfStack_16dd8 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_16dc0,apfStack_16900[lVar11]->key,apfStack_16900[lVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_16dd8 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_16da8,pfStack_16dc0);
    doc = pfStack_16dc0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_16dc0->key;
    __s = apfStack_16900[lVar11];
    pcVar16 = (char *)__s->key;
    pfStack_16dd8 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar16,pfStack_16dc0->keylen);
    pfVar13 = doc;
    if (iVar4 != 0) {
      pfStack_16dd8 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar16 = (char *)__s->meta;
    pfStack_16dd8 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar16,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar16 = (char *)__s->body;
    pfStack_16dd8 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar16,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_16dd8 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_16dc0 = (fdb_doc *)0x0;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3000) {
      pfStack_16dd8 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_16db8);
      lVar11 = 0;
      do {
        pfStack_16dd8 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_16900[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3000);
      pfStack_16dd8 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_16dd8 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_16dd8 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar16,"long key test");
      return;
    }
  }
  pfStack_16dd8 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_16dd8 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_16dd8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_16e00 = &pfStack_16dc0;
  pcStack_16df8 = pcVar16;
  lStack_16df0 = lVar11;
  pfStack_16de8 = pfVar13;
  ppfStack_16de0 = doc_00;
  pfStack_16dd8 = __s;
  gettimeofday((timeval *)(auStack_1b288 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b2d0 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1b100.wal_threshold = 0x400;
  fStack_1b100.compaction_mode = '\0';
  fStack_1b100.durability_opt = '\x02';
  handle = (char *)&fStack_1ae08;
  ppfVar17 = apfStack_1b008;
  pcVar16 = "kvs%d";
  uVar15 = 0;
  ppfVar6 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar17,"dummy%d",(ulong)ppfVar6 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1b208 + (long)ppfVar6 + -10);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar17,&fStack_1b100);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1b2b0 = ppfVar6;
    pfStack_1b2a8 = (fdb_kvs_handle *)handle;
    do {
      ppfVar6 = ppfVar2;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar17,"kvs%d",(ulong)(uint)((int)ppfVar6 + (int)uVar15));
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)ppfVar17,&fStack_1b2a0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1b2d0 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar6 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar6 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar6 = (fdb_kvs_handle **)((long)ppfStack_1b2b0 + 1);
    uVar15 = uVar15 + 0x80;
    handle = (char *)&pfStack_1b2a8[1].bub_ctx.space_used;
  } while (ppfVar6 != (fdb_kvs_handle **)0x8);
  ppfVar6 = apfStack_1b208;
  ppfVar17 = apfStack_1af08;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar6,"key%08d",uVar15);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar17,"value%08d",uVar15);
      pcVar16 = *(char **)(&fStack_1ae08.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1190e0;
      sVar5 = strlen((char *)ppfVar6);
      ptr_handle = (char *)(sVar5 + 1);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1190ec;
      sVar5 = strlen((char *)ppfVar17);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar16,ppfVar6,(size_t)ptr_handle,ppfVar17,sVar5 + 1);
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b208[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b208[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar17 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_18e08;
  ppfVar6 = (fdb_kvs_handle **)(auStack_1b288 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1b288;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1aa08[(long)ppfVar17],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1b288._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1aa08[(long)ppfVar17],
                              (fdb_kvs_handle **)ptr_handle,auStack_1b288._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar17 = ppfVar17 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar17 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b208[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1b2b8;
  pfStack_1b2b8 = (fdb_kvs_handle *)0x0;
  ppfVar6 = &pfStack_1b2c0;
  handle = "key%08d";
  ppfVar17 = apfStack_1b208;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_18e08[(long)pfVar9],(fdb_iterator **)ppfVar6,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar15 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1b2c0,(fdb_doc **)ptr_handle);
      pcVar16 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar17,"key%08d",uVar15);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar17,(char *)pfStack_1b2b8->op_stats);
      if (iVar4 != 0) {
        pfStack_1b2d0 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1b2c0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1b2c0);
    pcVar16 = (char *)&(pfVar9->config).wal_threshold;
    bVar18 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar16;
  } while (bVar18);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1b2b8);
  ptr_handle = "key%08d";
  ppfVar6 = apfStack_1b208;
  ppfVar17 = (fdb_kvs_handle **)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar6,"key%08d",uVar15);
      handle = *(char **)(&fStack_1ae08.kvs_config.create_if_missing + (long)ppfVar17 * 8);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1192dd;
      sVar5 = strlen((char *)ppfVar6);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ppfVar6,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar17 = (fdb_kvs_handle **)((long)ppfVar17 + 1);
  } while (ppfVar17 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar6 = apfStack_1b008;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar6,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1b208[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar6);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1b2b8;
  pfStack_1b2b8 = (fdb_kvs_handle *)0x0;
  ppfVar6 = &pfStack_1b2c0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1ae08.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ppfVar6,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1b2c0,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1b2c0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1b2c0);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar18 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar18);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1b2b8);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1b208[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar16,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1b2d0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b648 = (code *)0x119494;
  ppfStack_1b2e8 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1b2e0 = ppfVar17;
  ppfStack_1b2d8 = ppfVar6;
  pfStack_1b2d0 = pfVar9;
  gettimeofday(&tStack_1b5f8,(__timezone_ptr_t)0x0);
  pcStack_1b648 = (code *)0x119499;
  memleak_start();
  pcStack_1b648 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar10 = &fStack_1b5e8;
  pcStack_1b648 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1b648 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1b648 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1b628,"./dummy1",pfVar10);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b648 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1b628,&pfStack_1b620,"db",&fStack_1b610);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1b648 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1b628,&pfStack_1b618,"db2",&fStack_1b610);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar10 = &fStack_1b3f0;
    pcStack_1b648 = (code *)0x119539;
    sprintf((char *)pfVar10,"key%d",0);
    ppfVar6 = apfStack_1b4f0;
    pcStack_1b648 = (code *)0x119554;
    sprintf((char *)ppfVar6,"body%d",0);
    pcStack_1b648 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar10);
    pcStack_1b648 = (code *)0x119567;
    sVar5 = strlen((char *)ppfVar6);
    ppfVar17 = &pfStack_1b630;
    pcStack_1b648 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar17,pfVar10,(size_t)pfVar9,(void *)0x0,0,ppfVar6,sVar5 + 1);
    pcStack_1b648 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1b648 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1b628,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1b648 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1b630->field_6).seqtree,"bOdy%d",0);
    pcStack_1b648 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1b618,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1b648 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1b628,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1b648 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1b648 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1b618,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1b648 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b648 = (code *)0x11964d;
      fdb_close(pfStack_1b628);
      pcStack_1b648 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1b630);
      pcStack_1b648 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1b648 = (code *)0x119661;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_1b648 = (code *)0x119692;
      fprintf(_stderr,pcVar16,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b648 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1b648 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1b648 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1b648 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1b648 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1b648 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1b648 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1b648 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1b648 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b648 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b670 = pfVar10;
  ppfStack_1b668 = ppfVar17;
  pfStack_1b660 = (fdb_kvs_handle *)pcVar16;
  ppfStack_1b658 = ppfVar6;
  pfStack_1b650 = pfVar9;
  pcStack_1b648 = (code *)uVar15;
  gettimeofday(&tStack_1ba80,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1ba70.wal_threshold = 0x400;
  fStack_1ba70.flags = 1;
  fStack_1ba70.purging_interval = 0;
  fStack_1ba70.compaction_threshold = '\0';
  fStack_1ba70.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1ba70.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1bad8,"./dummy1",&fStack_1ba70);
  fdb_kvs_open_default(pfStack_1bad8,&pfStack_1bae0,&fStack_1ba98);
  fVar3 = fdb_set_log_callback(pfStack_1bae0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1bae0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar15 = 0;
    do {
      sprintf(acStack_1b878,"key%d",uVar15);
      sprintf(acStack_1b778,"body%d",uVar15);
      pfVar9 = pfStack_1bae0;
      sVar5 = strlen(acStack_1b878);
      sVar7 = strlen(acStack_1b778);
      fVar3 = fdb_set_kv(pfVar9,acStack_1b878,sVar5,acStack_1b778,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1bac8[1] = 0x726162ffffffff;
    asStack_1bac8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1bab0 = 0xbdbdbdbd;
    uStack_1baac = 0xbdbdbdbd;
    uStack_1baa8 = 0xbdbdbdbd;
    uStack_1baa4 = 0xbdbdbdbd;
    uStack_1baa0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1bad8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1bae0);
    fdb_close(pfStack_1bad8);
    fStack_1ba70.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1ba70.encryption_key.bytes,"bar",4);
    fStack_1ba70.encryption_key.bytes[4] = 0xbd;
    fStack_1ba70.encryption_key.bytes[5] = 0xbd;
    fStack_1ba70.encryption_key.bytes[6] = 0xbd;
    fStack_1ba70.encryption_key.bytes[7] = 0xbd;
    fStack_1ba70.encryption_key.bytes[8] = 0xbd;
    fStack_1ba70.encryption_key.bytes[9] = 0xbd;
    fStack_1ba70.encryption_key.bytes[10] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xb] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xc] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xd] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xe] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xf] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x10] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x11] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x12] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x13] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x14] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x15] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x16] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x17] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x18] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x19] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1bad8,"./dummy1",&fStack_1ba70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1bad8,&pfStack_1bae0,&fStack_1ba98);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1bae0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar15 = 0;
      while( true ) {
        sprintf(acStack_1b878,"key%d",uVar15);
        pfVar9 = pfStack_1bae0;
        sVar5 = strlen(acStack_1b878);
        fVar3 = fdb_get_kv(pfVar9,acStack_1b878,sVar5,&pvStack_1bad0,asStack_1bac8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b978,"body%d",uVar15);
        ptr = pvStack_1bad0;
        iVar4 = bcmp(pvStack_1bad0,acStack_1b978,asStack_1bac8[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1bae0);
          fdb_close(pfStack_1bad8);
          fdb_shutdown();
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar16,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void auto_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char key[256], value[256];
    void *value_out;
    size_t valuelen;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.auto_commit = true;

    // open db
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // retrieve check before close
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close & reopen
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve check again
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    // free all resources
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto commit test");
}